

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

LoopAnalysis * __thiscall
dxil_spv::CFGStructurizer::analyze_loop
          (LoopAnalysis *__return_storage_ptr__,CFGStructurizer *this,CFGNode *node)

{
  Vector<CFGNode_*> *this_00;
  uint uVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  CFGNode **ppCVar4;
  CFGNode **ppCVar5;
  Vector<CFGNode_*> *pVVar6;
  LoopAnalysis *this_01;
  bool bVar7;
  LoopExitType LVar8;
  pointer ppCVar9;
  pointer *pppCVar10;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var11;
  Vector<CFGNode_*> *pVVar12;
  iterator iVar13;
  pointer ppCVar14;
  CFGNode *pCVar15;
  pointer *pppCVar16;
  __node_base _Var17;
  pointer ppCVar18;
  pointer ppCVar19;
  bool bVar20;
  CFGNode *loop_exit;
  Vector<CFGNode_*> *__range3;
  LoopBacktracer tracer;
  LoopMergeTracer merge_tracer;
  CFGNode *local_110;
  LoopAnalysis *local_108;
  LoopAnalysis *local_100;
  CFGNode *local_f8;
  LoopAnalysis *local_f0;
  LoopAnalysis *local_e8;
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_e0;
  LoopMergeTracer local_a8;
  
  memset(__return_storage_ptr__,0,0x90);
  local_e0._M_buckets = &local_e0._M_single_bucket;
  local_e0._M_bucket_count = 1;
  local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0._M_element_count = 0;
  local_e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0._M_rehash_policy._M_next_resize = 0;
  local_e0._M_single_bucket = (__node_base_ptr)0x0;
  LoopBacktracer::trace_to_parent((LoopBacktracer *)&local_e0,node,node->pred_back_edge);
  local_a8.loop_exits._M_h._M_buckets = &local_a8.loop_exits._M_h._M_single_bucket;
  local_a8.loop_exits._M_h._M_bucket_count = 1;
  local_a8.loop_exits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.loop_exits._M_h._M_element_count = 0;
  local_a8.loop_exits._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.loop_exits._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.loop_exits._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.traced_blocks._M_h._M_buckets = &local_a8.traced_blocks._M_h._M_single_bucket;
  local_a8.traced_blocks._M_h._M_bucket_count = 1;
  local_a8.traced_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.traced_blocks._M_h._M_element_count = 0;
  local_a8.traced_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.traced_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.backtracer = (LoopBacktracer *)&local_e0;
  LoopMergeTracer::trace_from_parent(&local_a8,node);
  if (local_a8.loop_exits._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_108 = (LoopAnalysis *)&__return_storage_ptr__->non_dominated_exit;
    local_f8 = (CFGNode *)&__return_storage_ptr__->dominated_continue_exit;
    local_100 = (LoopAnalysis *)&__return_storage_ptr__->inner_dominated_exit;
    local_e8 = (LoopAnalysis *)&__return_storage_ptr__->dominated_exit;
    local_f0 = (LoopAnalysis *)&__return_storage_ptr__->inner_direct_exits;
    _Var17._M_nxt = local_a8.loop_exits._M_h._M_before_begin._M_nxt;
    do {
      local_110 = (CFGNode *)_Var17._M_nxt[1]._M_nxt;
      LVar8 = get_loop_exit_type(this,node,local_110);
      switch(LVar8) {
      case Exit:
        iVar13._M_current =
             (__return_storage_ptr__->direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = (CFGNode *)__return_storage_ptr__;
        if (iVar13._M_current ==
            (__return_storage_ptr__->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0013282e:
          std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
          _M_realloc_insert<dxil_spv::CFGNode*const&>
                    ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                      *)pCVar15,iVar13,&local_110);
        }
        else {
          *iVar13._M_current = local_110;
          pppCVar16 = &(__return_storage_ptr__->direct_exits).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar16 = *pppCVar16 + 1;
        }
        break;
      case Merge:
        iVar13._M_current =
             (__return_storage_ptr__->dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = (CFGNode *)local_e8;
        if (iVar13._M_current ==
            (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013282e;
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->dominated_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
        break;
      case Escape:
        iVar13._M_current =
             (__return_storage_ptr__->non_dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = (CFGNode *)local_108;
        if (iVar13._M_current ==
            (__return_storage_ptr__->non_dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013282e;
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->non_dominated_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
        break;
      case MergeToInfiniteLoop:
        iVar13._M_current =
             (__return_storage_ptr__->dominated_continue_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = local_f8;
        if (iVar13._M_current ==
            (__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013282e;
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->dominated_continue_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
        break;
      case InnerLoopExit:
        iVar13._M_current =
             (__return_storage_ptr__->inner_direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = (CFGNode *)local_f0;
        if (iVar13._M_current ==
            (__return_storage_ptr__->inner_direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013282e;
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->inner_direct_exits).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
        break;
      case InnerLoopMerge:
        iVar13._M_current =
             (__return_storage_ptr__->inner_dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar15 = (CFGNode *)local_100;
        if (iVar13._M_current ==
            (__return_storage_ptr__->inner_dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013282e;
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->inner_dominated_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
      }
      _Var17._M_nxt = (_Var17._M_nxt)->_M_nxt;
    } while (_Var17._M_nxt != (_Hash_node_base *)0x0);
  }
  local_100 = (LoopAnalysis *)&__return_storage_ptr__->dominated_continue_exit;
  ppCVar18 = (__return_storage_ptr__->dominated_continue_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar9 = (__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_f8 = node;
  if (ppCVar18 != ppCVar9) {
    local_108 = (LoopAnalysis *)&__return_storage_ptr__->non_dominated_exit;
    do {
      local_110 = *ppCVar18;
      ppCVar9 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar9 == ppCVar2) {
        bVar7 = false;
      }
      else {
        bVar7 = false;
        do {
          ppCVar19 = ppCVar9 + 1;
          if (local_110 == *ppCVar9) {
            bVar20 = true;
          }
          else {
            uVar1 = (*ppCVar9)->forward_post_visit_order;
            bVar20 = ((this->reachability_bitset).
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(ulong)(this->reachability_stride * local_110->forward_post_visit_order) +
                       (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) != 0;
          }
          if (bVar20) {
            iVar13._M_current =
                 (__return_storage_ptr__->non_dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                (__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
              _M_realloc_insert<dxil_spv::CFGNode*const&>
                        ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                          *)local_108,iVar13,&local_110);
            }
            else {
              *iVar13._M_current = local_110;
              pppCVar16 = &(__return_storage_ptr__->non_dominated_exit).
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              *pppCVar16 = *pppCVar16 + 1;
            }
            ppCVar14 = ppCVar18 + 1;
            ppCVar9 = (__return_storage_ptr__->dominated_continue_exit).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar14 != ppCVar9) {
              memmove(ppCVar18,ppCVar14,(long)ppCVar9 - (long)ppCVar14);
            }
            pppCVar16 = &(__return_storage_ptr__->dominated_continue_exit).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            *pppCVar16 = *pppCVar16 + -1;
            bVar7 = true;
          }
          ppCVar9 = ppCVar19;
        } while (!(bool)(bVar20 | ppCVar19 == ppCVar2));
      }
      if (!bVar7) {
        ppCVar9 = (__return_storage_ptr__->non_dominated_exit).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = (__return_storage_ptr__->non_dominated_exit).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar9 != ppCVar2) {
          do {
            ppCVar19 = ppCVar9 + 1;
            if (local_110 == *ppCVar9) {
              bVar20 = true;
            }
            else {
              uVar1 = (*ppCVar9)->forward_post_visit_order;
              bVar20 = ((this->reachability_bitset).
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(ulong)(this->reachability_stride * local_110->forward_post_visit_order) +
                         (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) != 0;
            }
            if (bVar20) {
              iVar13._M_current =
                   (__return_storage_ptr__->non_dominated_exit).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar13._M_current ==
                  (__return_storage_ptr__->non_dominated_exit).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
                _M_realloc_insert<dxil_spv::CFGNode*const&>
                          ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                            *)local_108,iVar13,&local_110);
              }
              else {
                *iVar13._M_current = local_110;
                pppCVar16 = &(__return_storage_ptr__->non_dominated_exit).
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                *pppCVar16 = *pppCVar16 + 1;
              }
              ppCVar14 = ppCVar18 + 1;
              ppCVar9 = (__return_storage_ptr__->dominated_continue_exit).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (ppCVar14 != ppCVar9) {
                memmove(ppCVar18,ppCVar14,(long)ppCVar9 - (long)ppCVar14);
              }
              pppCVar16 = &(__return_storage_ptr__->dominated_continue_exit).
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              *pppCVar16 = *pppCVar16 + -1;
              bVar7 = true;
            }
            ppCVar9 = ppCVar19;
          } while (!(bool)(bVar20 | ppCVar19 == ppCVar2));
        }
      }
      ppCVar18 = ppCVar18 + ((byte)~bVar7 & 1);
      ppCVar9 = (__return_storage_ptr__->dominated_continue_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (ppCVar18 != ppCVar9);
  }
  pCVar15 = local_f8;
  this_01 = local_100;
  if (8 < (ulong)((long)ppCVar9 - *(long *)local_100)) {
    local_110 = find_common_post_dominator(&local_100->direct_exits);
    if ((local_110 == (CFGNode *)0x0) || (bVar7 = CFGNode::dominates(pCVar15,local_110), !bVar7)) {
      std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>>
                ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                 &__return_storage_ptr__->non_dominated_exit,
                 (__return_storage_ptr__->non_dominated_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ppCVar18 = (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppCVar18) {
        (__return_storage_ptr__->dominated_continue_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar18;
      }
    }
    else {
      ppCVar18 = (__return_storage_ptr__->dominated_continue_exit).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppCVar18) {
        (__return_storage_ptr__->dominated_continue_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar18;
      }
      iVar13._M_current =
           (__return_storage_ptr__->dominated_continue_exit).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        _M_realloc_insert<dxil_spv::CFGNode*const&>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   this_01,iVar13,&local_110);
      }
      else {
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->dominated_continue_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
      }
    }
  }
  ppCVar18 = (__return_storage_ptr__->dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar9 = (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar18 == ppCVar9) {
    ppCVar2 = (__return_storage_ptr__->inner_dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar19 = (__return_storage_ptr__->inner_dominated_exit).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar2 != ppCVar19) {
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar2;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar19;
      ppCVar2 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->inner_dominated_exit).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar18;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar9;
      (__return_storage_ptr__->inner_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar2;
    }
  }
  ppCVar18 = (__return_storage_ptr__->direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar9 = (__return_storage_ptr__->direct_exits).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar18 == ppCVar9) {
    ppCVar2 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (__return_storage_ptr__->inner_direct_exits).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppCVar19 = (__return_storage_ptr__->inner_direct_exits).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->inner_direct_exits).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar19;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar18;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar9;
    (__return_storage_ptr__->inner_direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar2;
  }
  ppCVar18 = (__return_storage_ptr__->dominated_exit).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar9 = (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar18 == ppCVar9) {
    ppCVar2 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar19 = (__return_storage_ptr__->direct_exits).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar2 != ppCVar19) {
      ppCVar14 = (__return_storage_ptr__->direct_exits).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppCVar3 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar2;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar19;
      (__return_storage_ptr__->dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar14;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppCVar18;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar9;
      (__return_storage_ptr__->direct_exits).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar3;
    }
  }
  this_00 = &__return_storage_ptr__->dominated_exit;
  ppCVar18 = (__return_storage_ptr__->direct_exits).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((((long)(__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar18 == 8) &&
      ((__return_storage_ptr__->dominated_exit).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->dominated_exit).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->non_dominated_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    bVar7 = CFGNode::dominates(pCVar15,*ppCVar18);
    pVVar12 = &__return_storage_ptr__->non_dominated_exit;
    if (bVar7) {
      pVVar12 = this_00;
    }
    ppCVar18 = (pVVar12->
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pVVar6 = &__return_storage_ptr__->dominated_exit;
    if (!bVar7) {
      pVVar6 = &__return_storage_ptr__->non_dominated_exit;
    }
    pppCVar16 = &(pVVar6->
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    ppCVar9 = *pppCVar16;
    pVVar6 = &__return_storage_ptr__->dominated_exit;
    if (!bVar7) {
      pVVar6 = &__return_storage_ptr__->non_dominated_exit;
    }
    pppCVar10 = &(pVVar6->
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppCVar2 = *pppCVar10;
    (pVVar12->
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (__return_storage_ptr__->direct_exits).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *pppCVar16 = (__return_storage_ptr__->direct_exits).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar10 = (__return_storage_ptr__->direct_exits).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = ppCVar18;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar9;
    (__return_storage_ptr__->direct_exits).
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar2;
  }
  if (8 < (ulong)((long)(__return_storage_ptr__->dominated_exit).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->dominated_exit).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    local_110 = find_common_post_dominator(this_00);
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                       ((__return_storage_ptr__->dominated_exit).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (__return_storage_ptr__->dominated_exit).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    ppCVar4 = (__return_storage_ptr__->dominated_exit).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var11._M_current != ppCVar4) {
      ppCVar5 = (this_00->
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ppCVar4 != ppCVar5) {
        (__return_storage_ptr__->dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar5;
      }
      iVar13._M_current =
           (__return_storage_ptr__->dominated_exit).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (__return_storage_ptr__->dominated_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        _M_realloc_insert<dxil_spv::CFGNode*const&>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   this_00,iVar13,&local_110);
      }
      else {
        *iVar13._M_current = local_110;
        pppCVar16 = &(__return_storage_ptr__->dominated_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar16 = *pppCVar16 + 1;
      }
    }
  }
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8.traced_blocks._M_h);
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8.loop_exits._M_h);
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

CFGStructurizer::LoopAnalysis CFGStructurizer::analyze_loop(CFGNode *node) const
{
	LoopAnalysis result;

	// Now, we need to figure out which blocks belong in the loop construct.
	// The way to figure out a natural loop is any block which is dominated by loop header
	// and control flow passes to one of the back edges.

	// Unfortunately, it can be ambiguous which block is the merge block for a loop.
	// Ideally, there is a unique block which is the loop exit block, but if there are multiple breaks
	// there are multiple blocks which are not part of the loop construct.

	LoopBacktracer tracer;
	auto *pred = node->pred_back_edge;

	// Back-trace from here.
	// The CFG is reducible, so node must dominate pred.
	// Since node dominates pred, there is no pred chain we can follow without
	// eventually hitting node, and we'll stop traversal there.

	// All nodes which are touched during this traversal must be part of the loop construct.
	tracer.trace_to_parent(node, pred);

	LoopMergeTracer merge_tracer(tracer);
	merge_tracer.trace_from_parent(node);

	for (auto *loop_exit : merge_tracer.loop_exits)
	{
		auto exit_type = get_loop_exit_type(*node, *loop_exit);
		switch (exit_type)
		{
		case LoopExitType::Exit:
			result.direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopExit:
			// It's not an exit for us, but the inner loop.
			result.inner_direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::Merge:
			result.dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopMerge:
			result.inner_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopFalsePositive:
			// In this case, the inner loop can only exit at the loop header,
			// and thus post-dominance analysis will always fail.
			// Ignore this case as it's a false exit.
			break;

		case LoopExitType::Escape:
			result.non_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::MergeToInfiniteLoop:
			result.dominated_continue_exit.push_back(loop_exit);
			break;
		}
	}

	// A dominated continue exit should not be considered as such if it can reach other "normal" exits.
	// In this case, it's just a break.
	auto continue_itr = result.dominated_continue_exit.begin();
	while (continue_itr != result.dominated_continue_exit.end())
	{
		auto *candidate = *continue_itr;
		bool found_candidate = false;
		for (auto *dominated : result.dominated_exit)
		{
			if (query_reachability(*candidate, *dominated))
			{
				result.non_dominated_exit.push_back(candidate);
				continue_itr = result.dominated_continue_exit.erase(continue_itr);
				found_candidate = true;
				break;
			}
		}

		if (!found_candidate)
		{
			for (auto *non_dominated : result.non_dominated_exit)
			{
				if (query_reachability(*candidate, *non_dominated))
				{
					result.non_dominated_exit.push_back(candidate);
					continue_itr = result.dominated_continue_exit.erase(continue_itr);
					found_candidate = true;
					break;
				}
			}
		}

		if (!found_candidate)
			++continue_itr;
	}

	if (result.dominated_continue_exit.size() > 1)
	{
		// If we have multiple continue exit candidates, they better merge into a single clean candidate that we
		// still dominate, otherwise, ignore this case and treat them all as normal Escape nodes.
		auto *common = find_common_post_dominator(result.dominated_continue_exit);
		if (common && node->dominates(common))
		{
			result.dominated_continue_exit.clear();
			result.dominated_continue_exit.push_back(common);
		}
		else
		{
			result.non_dominated_exit.insert(result.non_dominated_exit.end(),
			                                 result.dominated_continue_exit.begin(),
			                                 result.dominated_continue_exit.end());
			result.dominated_continue_exit.clear();
		}
	}

	// If the only merge candidates we have are inner dominated, treat them as true dominated exits.
	if (result.dominated_exit.empty() && !result.inner_dominated_exit.empty())
		std::swap(result.dominated_exit, result.inner_dominated_exit);

	// If there are no direct exists, treat inner direct exists as direct exits.
	if (result.direct_exits.empty())
		std::swap(result.direct_exits, result.inner_direct_exits);

	// A direct exit can be considered a dominated exit if there are no better candidates.
	if (result.dominated_exit.empty() && !result.direct_exits.empty())
		std::swap(result.dominated_exit, result.direct_exits);

	// If we only have one direct exit, consider it our merge block.
	// Pick either Merge or Escape.
	if (result.direct_exits.size() == 1 && result.dominated_exit.empty() && result.non_dominated_exit.empty())
	{
		if (node->dominates(result.direct_exits.front()))
			std::swap(result.dominated_exit, result.direct_exits);
		else
			std::swap(result.non_dominated_exit, result.direct_exits);
	}

	if (result.dominated_exit.size() >= 2)
	{
		// Try to see if we can reduce the number of merge blocks to just 1.
		// This is relevant if we have various "clean" break blocks.
		auto *post_dominator = find_common_post_dominator(result.dominated_exit);
		if (std::find(result.dominated_exit.begin(), result.dominated_exit.end(),
		              post_dominator) != result.dominated_exit.end())
		{
			result.dominated_exit.clear();
			result.dominated_exit.push_back(post_dominator);
		}
	}

	return result;
}